

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

int __thiscall wasm::SExpressionWasmBuilder::parseIndex(SExpressionWasmBuilder *this,Element *s)

{
  int iVar1;
  _Alloc_hider __nptr;
  int *piVar2;
  long lVar3;
  char *local_90;
  string local_88 [2];
  Element *local_48;
  
  local_48 = s;
  Element::toString_abi_cxx11_(local_88,s);
  __nptr._M_p = local_88[0]._M_dataplus._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr._M_p,&local_90,10);
  if (local_90 == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88[0]._M_dataplus._M_p != &local_88[0].field_2) {
      operator_delete(local_88[0]._M_dataplus._M_p,local_88[0].field_2._M_allocated_capacity + 1);
    }
    return (int)lVar3;
  }
  std::__throw_out_of_range("stoi");
}

Assistant:

int SExpressionWasmBuilder::parseIndex(Element& s) {
  try {
    return std::stoi(s.toString());
  } catch (...) {
    throw ParseException("expected integer", s.line, s.col);
  }
}